

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.cpp
# Opt level: O3

vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> * __thiscall
myvk::BufferBase::GetSrcMemoryBarriers
          (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
           *__return_storage_ptr__,BufferBase *this,
          vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *regions,
          VkAccessFlags src_access_mask,VkAccessFlags dst_access_mask,uint32_t src_queue_family,
          uint32_t dst_queue_family)

{
  pointer pVVar1;
  pointer pVVar2;
  VkBuffer pVVar3;
  VkDeviceSize VVar4;
  long lVar5;
  ulong uVar6;
  VkDeviceSize VVar7;
  ulong uVar8;
  ulong uVar9;
  VkDeviceSize VVar10;
  allocator_type local_39;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *local_38;
  
  local_38 = __return_storage_ptr__;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            (__return_storage_ptr__,
             ((long)(regions->
                    super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(regions->
                    super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,&local_39);
  pVVar1 = (regions->super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(regions->super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>)
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
  if (lVar5 != 0) {
    uVar6 = (lVar5 >> 3) * 0x6db6db6db6db6db7;
    pVVar2 = (local_38->
             super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar3 = this->m_buffer;
    VVar4 = this->m_size;
    uVar8 = 0;
    do {
      pVVar2[uVar8].sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
      if (uVar6 - 1 == uVar8) {
        VVar10 = pVVar1[uVar6 - 1].bufferOffset;
        VVar7 = VVar4 - VVar10;
        uVar9 = (ulong)((int)uVar8 + 1);
      }
      else {
        uVar9 = (ulong)((int)uVar8 + 1);
        VVar10 = pVVar1[uVar8].bufferOffset;
        VVar7 = pVVar1[uVar9].bufferOffset - VVar10;
      }
      pVVar2[uVar8].size = VVar7;
      pVVar2[uVar8].buffer = pVVar3;
      pVVar2[uVar8].offset = VVar10;
      pVVar2[uVar8].srcAccessMask = src_access_mask;
      pVVar2[uVar8].dstAccessMask = dst_access_mask;
      pVVar2[uVar8].srcQueueFamilyIndex = src_queue_family;
      pVVar2[uVar8].dstQueueFamilyIndex = dst_queue_family;
      uVar8 = uVar9;
    } while (uVar9 <= uVar6 && uVar6 - uVar9 != 0);
  }
  return local_38;
}

Assistant:

std::vector<VkBufferMemoryBarrier> BufferBase::GetSrcMemoryBarriers(const std::vector<VkBufferImageCopy> &regions,
                                                                    VkAccessFlags src_access_mask,
                                                                    VkAccessFlags dst_access_mask,
                                                                    uint32_t src_queue_family,
                                                                    uint32_t dst_queue_family) const {
	std::vector<VkBufferMemoryBarrier> barriers(regions.size());
	for (uint32_t i = 0; i < regions.size(); i++) {
		VkBufferMemoryBarrier &cur = barriers[i];
		cur.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
		cur.size = (i == regions.size() - 1) ? m_size - regions[i].bufferOffset
		                                     : regions[i + 1].bufferOffset - regions[i].bufferOffset;

		cur.buffer = m_buffer;
		cur.offset = regions[i].bufferOffset;
		cur.srcAccessMask = src_access_mask;
		cur.dstAccessMask = dst_access_mask;

		cur.srcQueueFamilyIndex = src_queue_family;
		cur.dstQueueFamilyIndex = dst_queue_family;
	}
	return barriers;
}